

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O2

void ts_tree_cursor_init(TreeCursor *self,TSNode node)

{
  uint uVar1;
  TreeCursorEntry *pTVar2;
  
  self->tree = node.tree;
  (self->stack).size = 0;
  array__grow((VoidArray *)&self->stack,0x20);
  pTVar2 = (self->stack).contents;
  uVar1 = (self->stack).size;
  (self->stack).size = uVar1 + 1;
  pTVar2[uVar1].subtree = (Subtree *)node.id;
  pTVar2[uVar1].position.bytes = node.context[0];
  pTVar2[uVar1].position.extent.row = node.context[1];
  pTVar2[uVar1].position.extent.column = node.context[2];
  pTVar2[uVar1].child_index = 0;
  pTVar2[uVar1].structural_child_index = 0;
  return;
}

Assistant:

void ts_tree_cursor_init(TreeCursor *self, TSNode node) {
  self->tree = node.tree;
  array_clear(&self->stack);
  array_push(&self->stack, ((TreeCursorEntry) {
    .subtree = (const Subtree *)node.id,
    .position = {
      ts_node_start_byte(node),
      ts_node_start_point(node)
    },
    .child_index = 0,
    .structural_child_index = 0,
  }));
}